

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O0

Vec_Int_t * Llb_DriverCollectNs(Aig_Man_t *pAig,Vec_Int_t *vDriRefs)

{
  Vec_Ptr_t *p;
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  int local_34;
  int i;
  Aig_Obj_t *pDri;
  Aig_Obj_t *pObj;
  Vec_Int_t *vVars;
  Vec_Int_t *vDriRefs_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManRegNum(pAig);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_34 = 0; iVar1 = Saig_ManRegNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p,local_34 + iVar1);
    pObj_01 = Aig_ObjFanin0(pObj_00);
    iVar1 = Aig_ObjId(pObj_01);
    iVar1 = Vec_IntEntry(vDriRefs,iVar1);
    if (((iVar1 == 1) && (iVar1 = Saig_ObjIsPi(pAig,pObj_01), iVar1 == 0)) &&
       (iVar1 = Aig_ObjIsConst1(pObj_01), iVar1 == 0)) {
      iVar1 = Aig_ObjId(pObj_01);
      Vec_IntPush(p_00,iVar1);
    }
    else {
      iVar1 = Aig_ObjId(pObj_00);
      Vec_IntPush(p_00,iVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_DriverCollectNs( Aig_Man_t * pAig, Vec_Int_t * vDriRefs )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj, * pDri;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pDri = Aig_ObjFanin0(pObj);
        if ( Vec_IntEntry( vDriRefs, Aig_ObjId(pDri) ) != 1 || Saig_ObjIsPi(pAig, pDri) || Aig_ObjIsConst1(pDri) )
            Vec_IntPush( vVars, Aig_ObjId(pObj) );
        else
            Vec_IntPush( vVars, Aig_ObjId(pDri) );
    }
    return vVars;
}